

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeT(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  float *pfVar2;
  float *e;
  int iVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  
  iVar1 = this->vw;
  iVar3 = (-1 << ((this->res).vlog2 & 0x1fU)) + this->v + iVar1;
  if (mode != m_black) {
    pfVar2 = this->kv;
    lVar4 = (long)iVar3;
    if (iVar3 == 0) {
      fVar6 = 0.0;
    }
    else {
      lVar5 = lVar4 * -4;
      fVar6 = 0.0;
      do {
        fVar6 = fVar6 + *(float *)((long)pfVar2 + lVar5 + (long)iVar1 * 4);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0);
    }
    pfVar2[(long)iVar1 + (-1 - lVar4)] = fVar6 + pfVar2[(long)iVar1 + (-1 - lVar4)];
  }
  this->vw = iVar1 - iVar3;
  return;
}

Assistant:

void mergeT(BorderMode mode)
    {
        int w = vw + v - res.v();
        float* kp = kv + vw - w;
        if (mode != m_black)
            kp[-1] += accumulate(kp, w);
        vw -= w;
    }